

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianOptimizationWrapC.cpp
# Opt level: O0

void __thiscall
TasOptimization::convert_C_obj_fn_single(double(*)(int,double_const*,int*),std::__cxx11::string)::
$_0::__0(__0 *this,anon_class_40_2_d961b61f *param_1)

{
  anon_class_40_2_d961b61f *param_1_local;
  anon_class_40_2_d961b61f *this_local;
  
  *(tsg_optim_obj_fn_single *)this = param_1->func_ptr;
  std::__cxx11::string::string((string *)(this + 8),(string *)&param_1->err_msg);
  return;
}

Assistant:

ObjectiveFunctionSingle convert_C_obj_fn_single(tsg_optim_obj_fn_single func_ptr, std::string err_msg) {
    return [=](const std::vector<double> &x_single)->double {
        int err_code = 0;
        int num_dims = x_single.size();
        double result = (*func_ptr)(num_dims, x_single.data(), &err_code);
        if (err_code != 0) throw std::runtime_error(err_msg);
        return result;
    };
}